

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall
QRenderRule::drawBackgroundImage(QRenderRule *this,QPainter *p,QRect *rect,QPoint off)

{
  Repeat RVar1;
  QStyleSheetBackgroundData *pQVar2;
  Representation RVar3;
  char cVar4;
  undefined4 uVar5;
  uint uVar6;
  Representation RVar7;
  int iVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QPixmap *pQVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  Representation RVar17;
  Representation RVar18;
  Representation RVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  QRect QVar25;
  QSize bgpSize;
  undefined1 local_98 [12];
  Representation RStack_8c;
  QSize local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->bg).d.ptr == (QStyleSheetBackgroundData *)0x0) ||
     ((cVar4 = QPixmap::isNull(), cVar4 != '\0' &&
      (*(int *)(*(long *)&((this->bg).d.ptr)->brush + 4) == 0)))) goto LAB_00357734;
  pQVar13 = &((this->bg).d.ptr)->pixmap;
  cVar4 = QPixmap::isNull();
  if (cVar4 != '\0') goto LAB_00357734;
  RVar19 = off.yp.m_i;
  local_58 = (undefined1  [16])borderRect(this,rect);
  setClip(this,p,(QRect *)local_58);
  pQVar2 = (this->bg).d.ptr;
  if (pQVar2->origin != pQVar2->clip) {
    QPainter::save();
    local_58 = (undefined1  [16])originRect(this,rect,((this->bg).d.ptr)->clip);
    QPainter::setClipRect((QRect *)p,(ClipOperation)local_58);
  }
  RVar17 = off.xp.m_i;
  if (((this->bg).d.ptr)->attachment == Attachment_Fixed) {
    RVar17.m_i = 0;
    RVar19.m_i = 0;
  }
  local_80 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  uVar9 = QPixmap::size();
  uVar5 = QPixmap::devicePixelRatio();
  auVar23._0_8_ = (double)(int)((ulong)uVar9 >> 0x20);
  auVar23._8_8_ = (double)(int)uVar9;
  auVar24._8_8_ = extraout_XMM0_Qa;
  auVar24._0_8_ = extraout_XMM0_Qa;
  auVar24 = divpd(auVar23,auVar24);
  auVar21._0_8_ =
       (double)((ulong)auVar24._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar24._0_8_;
  auVar21._8_8_ =
       (double)((ulong)auVar24._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar24._8_8_;
  auVar24 = minpd(_DAT_0066f5d0,auVar21);
  auVar22._8_8_ = -(ulong)(-2147483648.0 < auVar24._8_8_);
  auVar22._0_8_ = -(ulong)(-2147483648.0 < auVar24._0_8_);
  uVar6 = movmskpd(uVar5,auVar22);
  uVar14 = 0x8000000000000000;
  if ((uVar6 & 1) != 0) {
    uVar14 = (ulong)(uint)(int)auVar24._0_8_ << 0x20;
  }
  uVar20 = 0x80000000;
  if ((uVar6 & 2) != 0) {
    uVar20 = (ulong)(uint)(int)auVar24._8_8_;
  }
  local_80.ht.m_i = (int)(uVar14 >> 0x20);
  RVar3.m_i = local_80.ht.m_i;
  stack0xffffffffffffff70 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (this->bg).d.ptr;
  local_80 = (QSize)(uVar14 | uVar20);
  _local_98 = originRect(this,rect,pQVar2->origin);
  QVar25 = QStyle::alignedRect(LeftToRight,
                               (Alignment)
                               (pQVar2->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                               super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_80,(QRect *)local_98)
  ;
  RVar7 = QVar25.x1.m_i;
  local_58._0_4_ = RVar7.m_i - RVar17.m_i;
  RVar18 = QVar25.y1.m_i;
  local_58._8_4_ = QVar25.x2.m_i.m_i - RVar17.m_i;
  local_58._4_4_ = RVar18.m_i - RVar19.m_i;
  local_58._12_4_ = QVar25.y2.m_i.m_i - RVar19.m_i;
  auVar24 = QRect::operator&((QRect *)local_58,(QRect *)local_98);
  RVar1 = ((this->bg).d.ptr)->repeat;
  iVar12 = (int)uVar20;
  iVar11 = auVar24._4_4_;
  if (RVar1 == Repeat_X) {
    iVar10 = local_98._8_4_ - local_98._0_4_;
    iVar15 = auVar24._12_4_ - iVar11;
    iVar16 = (RVar17.m_i + iVar12) - (RVar7.m_i - local_98._0_4_) % iVar12;
    iVar8 = (RVar19.m_i - RVar18.m_i) + iVar11;
    iVar12 = local_98._0_4_;
LAB_0035762f:
    local_48 = (double)(iVar10 + 1);
    dStack_40 = (double)(iVar15 + 1);
    local_58._8_8_ = (double)iVar11;
    local_58._0_8_ = (double)iVar12;
LAB_00357664:
    local_70 = (double)iVar8;
    local_78 = (double)iVar16;
    QPainter::drawTiledPixmap((QRectF *)p,(QPixmap *)local_58,(QPointF *)pQVar13);
  }
  else {
    if (RVar1 == Repeat_XY) {
      iVar16 = (RVar17.m_i + iVar12) - (RVar7.m_i - local_98._0_4_) % iVar12;
      iVar8 = (RVar19.m_i + RVar3.m_i) - (RVar18.m_i - local_98._4_4_) % RVar3.m_i;
      local_48 = (double)(((long)(int)local_98._8_4_ - (long)(int)local_98._0_4_) + 1);
      local_58._8_8_ = (double)(int)local_98._4_4_;
      local_58._0_8_ = (double)(int)local_98._0_4_;
      dStack_40 = (double)(((long)RStack_8c.m_i - (long)(int)local_98._4_4_) + 1);
      goto LAB_00357664;
    }
    iVar12 = auVar24._0_4_;
    if (RVar1 == Repeat_Y) {
      iVar10 = auVar24._8_4_ - iVar12;
      iVar15 = RStack_8c.m_i - local_98._4_4_;
      iVar16 = (RVar17.m_i - RVar7.m_i) + iVar12;
      iVar8 = (RVar19.m_i + RVar3.m_i) - (RVar18.m_i - local_98._4_4_) % RVar3.m_i;
      iVar11 = local_98._4_4_;
      goto LAB_0035762f;
    }
    iVar15 = QPixmap::width();
    iVar10 = QPixmap::height();
    local_58._8_8_ = (double)iVar11;
    local_58._0_8_ = (double)iVar12;
    local_78 = (double)((RVar17.m_i - RVar7.m_i) + iVar12);
    local_70 = (double)((RVar19.m_i - RVar18.m_i) + iVar11);
    local_68 = (double)iVar15;
    local_48 = -1.0;
    dStack_40 = -1.0;
    local_60 = (double)iVar10;
    QPainter::drawPixmap((QRectF *)p,(QPixmap *)local_58,(QRectF *)pQVar13);
  }
  pQVar2 = (this->bg).d.ptr;
  if (pQVar2->origin != pQVar2->clip) {
    QPainter::restore();
  }
  unsetClip(this,p);
LAB_00357734:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::drawBackgroundImage(QPainter *p, const QRect &rect, QPoint off)
{
    if (!hasBackground())
        return;

    const QPixmap& bgp = background()->pixmap;
    if (bgp.isNull())
        return;

    setClip(p, borderRect(rect));

    if (background()->origin != background()->clip) {
        p->save();
        p->setClipRect(originRect(rect, background()->clip), Qt::IntersectClip);
    }

    if (background()->attachment == Attachment_Fixed)
        off = QPoint(0, 0);

    QSize bgpSize = bgp.size() / bgp.devicePixelRatio();
    int bgpHeight = bgpSize.height();
    int bgpWidth = bgpSize.width();
    QRect r = originRect(rect, background()->origin);
    QRect aligned = QStyle::alignedRect(Qt::LeftToRight, background()->position, bgpSize, r);
    QRect inter = aligned.translated(-off).intersected(r);

    switch (background()->repeat) {
    case Repeat_Y:
        p->drawTiledPixmap(inter.x(), r.y(), inter.width(), r.height(), bgp,
                           inter.x() - aligned.x() + off.x(),
                           bgpHeight - int(aligned.y() - r.y()) % bgpHeight + off.y());
        break;
    case Repeat_X:
        p->drawTiledPixmap(r.x(), inter.y(), r.width(), inter.height(), bgp,
                           bgpWidth - int(aligned.x() - r.x())%bgpWidth + off.x(),
                           inter.y() - aligned.y() + off.y());
        break;
    case Repeat_XY:
        p->drawTiledPixmap(r, bgp,
                            QPoint(bgpWidth - int(aligned.x() - r.x())% bgpWidth + off.x(),
                                   bgpHeight - int(aligned.y() - r.y())%bgpHeight + off.y()));
        break;
    case Repeat_None:
    default:
        p->drawPixmap(inter.x(), inter.y(), bgp, inter.x() - aligned.x() + off.x(),
                      inter.y() - aligned.y() + off.y(), bgp.width() , bgp.height());
        break;
    }


    if (background()->origin != background()->clip)
        p->restore();

    unsetClip(p);
}